

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apinames.cpp
# Opt level: O0

int test_cpp(void)

{
  undefined8 uVar1;
  bool bVar2;
  value_type vVar3;
  int iVar4;
  size_type sVar5;
  ulong uVar6;
  ostream *poVar7;
  reference pvVar8;
  ulong uVar9;
  char *pcVar10;
  undefined1 *puVar11;
  undefined1 local_1f4;
  allocator<char> local_111;
  string local_110 [32];
  int local_f0;
  int local_ec;
  Api api_1;
  Api api;
  size_t j;
  string name_2;
  size_t i_1;
  string displayName_1;
  string name_1;
  string displayName;
  string name;
  size_t i;
  undefined1 local_20 [8];
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::vector
            ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20);
  RtMidi::getCompiledApi((vector *)local_20);
  std::operator<<((ostream *)&std::cout,"API names by identifier (C++):\n");
  name.field_2._8_8_ = 0;
  while( true ) {
    sVar5 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::size
                      ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20);
    if (sVar5 <= (ulong)name.field_2._8_8_) {
      RtMidi::getApiName_abi_cxx11_((int)&displayName_1 + 0x18);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Bad string for invalid API \'");
        poVar7 = std::operator<<(poVar7,(string *)(displayName_1.field_2._M_local_buf + 8));
        std::operator<<(poVar7,"\'\n");
        exit(1);
      }
      RtMidi::getApiDisplayName_abi_cxx11_((Api)&i_1);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i_1,"Unknown");
      if (!bVar2) {
        std::__cxx11::string::~string((string *)&i_1);
        std::__cxx11::string::~string((string *)(displayName_1.field_2._M_local_buf + 8));
        std::operator<<((ostream *)&std::cout,"API identifiers by name (C++):\n");
        name_2.field_2._8_8_ = 0;
        while( true ) {
          uVar1 = name_2.field_2._8_8_;
          sVar5 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::size
                            ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20);
          if (sVar5 <= (ulong)uVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_110,"",&local_111);
            local_f0 = RtMidi::getCompiledApiByName(local_110);
            std::__cxx11::string::~string(local_110);
            std::allocator<char>::~allocator(&local_111);
            if (local_f0 != 0) {
              std::operator<<((ostream *)&std::cout,"Bad identifier for unknown API name\n");
              exit(1);
            }
            std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~vector
                      ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20);
            return 0;
          }
          std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                    ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,
                     name_2.field_2._8_8_);
          RtMidi::getApiName_abi_cxx11_((Api)&j);
          vVar3 = RtMidi::getCompiledApiByName((string *)&j);
          pvVar8 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                             ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,
                              name_2.field_2._8_8_);
          if (vVar3 != *pvVar8) break;
          poVar7 = std::operator<<((ostream *)&std::cout,"* \'");
          poVar7 = std::operator<<(poVar7,(string *)&j);
          poVar7 = std::operator<<(poVar7,"\': ");
          pvVar8 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                             ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,
                              name_2.field_2._8_8_);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
          std::operator<<(poVar7,"\n");
          _api_1 = 0;
          while( true ) {
            uVar6 = _api_1;
            uVar9 = std::__cxx11::string::size();
            if (uVar9 <= uVar6) break;
            if ((_api_1 & 1) == 0) {
              pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)&j);
              iVar4 = tolower((int)*pcVar10);
              local_1f4 = (undefined1)iVar4;
            }
            else {
              pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)&j);
              iVar4 = toupper((int)*pcVar10);
              local_1f4 = (undefined1)iVar4;
            }
            puVar11 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&j);
            *puVar11 = local_1f4;
            _api_1 = _api_1 + 1;
          }
          local_ec = RtMidi::getCompiledApiByName((string *)&j);
          if (local_ec != 0) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Identifier ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_ec);
            poVar7 = std::operator<<(poVar7," for invalid API \'");
            poVar7 = std::operator<<(poVar7,(string *)&j);
            std::operator<<(poVar7,"\'\n");
            exit(1);
          }
          std::__cxx11::string::~string((string *)&j);
          name_2.field_2._8_8_ = name_2.field_2._8_8_ + 1;
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"Bad identifier for API \'");
        poVar7 = std::operator<<(poVar7,(string *)&j);
        std::operator<<(poVar7,"\'\n");
        exit(1);
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"Bad display string for invalid API \'");
      poVar7 = std::operator<<(poVar7,(string *)&i_1);
      std::operator<<(poVar7,"\'\n");
      exit(1);
    }
    std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
              ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,name.field_2._8_8_);
    RtMidi::getApiName_abi_cxx11_((int)&displayName + 0x18);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Invalid name for API ");
      pvVar8 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                         ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,
                          name.field_2._8_8_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
      std::operator<<(poVar7,"\n");
      exit(1);
    }
    std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
              ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,name.field_2._8_8_);
    RtMidi::getApiDisplayName_abi_cxx11_((int)&name_1 + 0x18);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) break;
    poVar7 = std::operator<<((ostream *)&std::cout,"* ");
    pvVar8 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                       ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,
                        name.field_2._8_8_);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
    poVar7 = std::operator<<(poVar7," \'");
    poVar7 = std::operator<<(poVar7,(string *)(displayName.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7,"\': \'");
    poVar7 = std::operator<<(poVar7,(string *)(name_1.field_2._M_local_buf + 8));
    std::operator<<(poVar7,"\'\n");
    std::__cxx11::string::~string((string *)(name_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(displayName.field_2._M_local_buf + 8));
    name.field_2._8_8_ = name.field_2._8_8_ + 1;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"Invalid display name for API ");
  pvVar8 = std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::operator[]
                     ((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)local_20,
                      name.field_2._8_8_);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pvVar8);
  std::operator<<(poVar7,"\n");
  exit(1);
}

Assistant:

int test_cpp() {
    std::vector<RtMidi::Api> apis;
    RtMidi::getCompiledApi( apis );

    // ensure the known APIs return valid names
    std::cout << "API names by identifier (C++):\n";
    for ( size_t i = 0; i < apis.size() ; ++i ) {
        const std::string name = RtMidi::getApiName(apis[i]);
        if (name.empty()) {
            std::cout << "Invalid name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        const std::string displayName = RtMidi::getApiDisplayName(apis[i]);
        if (displayName.empty()) {
            std::cout << "Invalid display name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        std::cout << "* " << (int)apis[i] << " '" << name << "': '" << displayName << "'\n";
    }

    // ensure unknown APIs return the empty string
    {
        const std::string name = RtMidi::getApiName((RtMidi::Api)-1);
        if (!name.empty()) {
            std::cout << "Bad string for invalid API '" << name << "'\n";
            exit(1);
        }
        const std::string displayName = RtMidi::getApiDisplayName((RtMidi::Api)-1);
        if (displayName!="Unknown") {
            std::cout << "Bad display string for invalid API '" << displayName << "'\n";
            exit(1);
        }
    }

    // try getting API identifier by name
    std::cout << "API identifiers by name (C++):\n";
    for ( size_t i = 0; i < apis.size() ; ++i ) {
        std::string name = RtMidi::getApiName(apis[i]);
        if ( RtMidi::getCompiledApiByName(name) != apis[i] ) {
            std::cout << "Bad identifier for API '" << name << "'\n";
            exit( 1 );
        }
        std::cout << "* '" << name << "': " << (int)apis[i] << "\n";

        for ( size_t j = 0; j < name.size(); ++j )
            name[j] = (j & 1) ? toupper(name[j]) : tolower(name[j]);
        RtMidi::Api api = RtMidi::getCompiledApiByName(name);
        if ( api != RtMidi::UNSPECIFIED ) {
            std::cout << "Identifier " << (int)api << " for invalid API '" << name << "'\n";
            exit( 1 );
        }
    }

    // try getting an API identifier by unknown name
    {
        RtMidi::Api api;
        api = RtMidi::getCompiledApiByName("");
        if ( api != RtMidi::UNSPECIFIED ) {
            std::cout << "Bad identifier for unknown API name\n";
            exit( 1 );
        }
    }

    return 0;
}